

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.c
# Opt level: O1

int Mig_ManSuppSizeTest(Mig_Man_t *p)

{
  Mig_Fan_t MVar1;
  Mig_Obj_t *pObj;
  Mig_Obj_t *pMVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int level;
  long lVar7;
  timespec ts;
  timespec local_30;
  
  iVar3 = clock_gettime(3,&local_30);
  if (iVar3 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  p->iPage = 0;
  if ((p->vPages).nSize < 1) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    uVar4 = 0;
    do {
      if ((int)uVar4 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pObj = (Mig_Obj_t *)(p->vPages).pArray[uVar4];
      p->pPage = pObj;
      if (pObj == (Mig_Obj_t *)0x0) break;
      MVar1 = pObj->pFans[3];
      while ((uint)MVar1 < 0xfffffffe) {
        if ((uint)pObj->pFans[1] < 0xfffffffe) {
          iVar3 = Mig_ManSuppSizeOne(pObj);
          uVar6 = uVar6 + (iVar3 < 0x11);
        }
        pMVar2 = pObj + 1;
        pObj = pObj + 1;
        MVar1 = pMVar2->pFans[3];
      }
      uVar4 = p->iPage + 1;
      p->iPage = uVar4;
    } while ((int)uVar4 < (p->vPages).nSize);
  }
  printf("Nodes with small support %d (out of %d)\n",(ulong)uVar6,
         (ulong)(uint)(~((p->vCos).nSize + (p->vCis).nSize) + p->nObjs));
  level = 3;
  iVar3 = clock_gettime(3,&local_30);
  if (iVar3 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar7 + lVar5) / 1000000.0);
  return uVar6;
}

Assistant:

int Mig_ManSuppSizeTest( Mig_Man_t * p )
{
    Mig_Obj_t * pObj;
    int Counter = 0;
    abctime clk = Abc_Clock();
    Mig_ManForEachObj( p, pObj )
        if ( Mig_ObjIsNode(pObj) )
            Counter += (Mig_ManSuppSizeOne(pObj) <= 16);
    printf( "Nodes with small support %d (out of %d)\n", Counter, Mig_ManNodeNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return Counter;
}